

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O3

Quat<float> __thiscall
Imath_2_5::slerp<float>(Imath_2_5 *this,Quat<float> *q1,Quat<float> *q2,float t)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  Quat<float> QVar12;
  
  fVar4 = angle4D<float>(q1,q2);
  fVar5 = (1.0 - t) * fVar4;
  fVar6 = 1.0;
  if (1.1920929e-07 <= fVar5 * fVar5) {
    fVar6 = sinf(fVar5);
    fVar6 = fVar6 / fVar5;
  }
  fVar5 = 1.0;
  if (1.1920929e-07 <= fVar4 * fVar4) {
    fVar5 = sinf(fVar4);
    fVar5 = fVar5 / fVar4;
  }
  fVar10 = (1.0 - t) * (fVar6 / fVar5);
  fVar5 = q1->r;
  fVar6 = (q1->v).x;
  fVar2 = (q1->v).y;
  fVar3 = (q1->v).z;
  fVar7 = fVar4 * t;
  fVar11 = 1.0;
  if (1.1920929e-07 <= fVar7 * fVar7) {
    fVar11 = sinf(fVar7);
    fVar11 = fVar11 / fVar7;
  }
  fVar7 = 1.0;
  if (1.1920929e-07 <= fVar4 * fVar4) {
    fVar7 = sinf(fVar4);
    fVar7 = fVar7 / fVar4;
  }
  fVar4 = (fVar11 / fVar7) * t;
  auVar8._0_4_ = fVar5 * fVar10 + fVar4 * q2->r;
  auVar8._4_4_ = fVar6 * fVar10 + fVar4 * (q2->v).x;
  auVar8._8_4_ = fVar2 * fVar10 + fVar4 * (q2->v).y;
  auVar8._12_4_ = fVar3 * fVar10 + fVar4 * (q2->v).z;
  QVar12.r = SQRT(auVar8._0_4_ * auVar8._0_4_ +
                  auVar8._12_4_ * auVar8._12_4_ +
                  auVar8._4_4_ * auVar8._4_4_ + auVar8._8_4_ * auVar8._8_4_);
  auVar1._4_4_ = QVar12.r;
  auVar1._0_4_ = QVar12.r;
  auVar1._8_4_ = QVar12.r;
  auVar1._12_4_ = QVar12.r;
  auVar9 = divps(auVar8,auVar1);
  if ((QVar12.r == 0.0) && (!NAN(QVar12.r))) {
    auVar9._0_12_ = ZEXT812(0x3f800000);
    auVar9._12_4_ = 0;
  }
  *(undefined1 (*) [16])this = auVar9;
  QVar12.v.x = QVar12.r;
  QVar12.v.y = 0.0;
  QVar12.v.z = 0.0;
  return QVar12;
}

Assistant:

Quat<T>
slerp (const Quat<T> &q1, const Quat<T> &q2, T t)
{
    //
    // Spherical linear interpolation.
    // Assumes q1 and q2 are normalized and that q1 != -q2.
    //
    // This method does *not* interpolate along the shortest
    // arc between q1 and q2.  If you desire interpolation
    // along the shortest arc, and q1^q2 is negative, then
    // consider calling slerpShortestArc(), below, or flipping
    // the second quaternion explicitly.
    //
    // The implementation of squad() depends on a slerp()
    // that interpolates as is, without the automatic
    // flipping.
    //
    // Don Hatch explains the method we use here on his
    // web page, The Right Way to Calculate Stuff, at
    // http://www.plunk.org/~hatch/rightway.php
    //

    T a = angle4D (q1, q2);
    T s = 1 - t;

    Quat<T> q = sinx_over_x (s * a) / sinx_over_x (a) * s * q1 +
	        sinx_over_x (t * a) / sinx_over_x (a) * t * q2;

    return q.normalized();
}